

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegVideo.h
# Opt level: O2

uint8_t * MPEGHeader::findNextMarker(uint8_t *buffer,uint8_t *end)

{
  long lVar1;
  long lVar2;
  byte *pbVar3;
  
  pbVar3 = buffer + 2;
  lVar1 = 3;
  while( true ) {
    if (end <= pbVar3) {
      return end;
    }
    lVar2 = lVar1;
    if ((((*pbVar3 < 2) && (lVar2 = 1, *pbVar3 != 0)) && (lVar2 = lVar1, pbVar3[-2] == 0)) &&
       (pbVar3[-1] == 0)) break;
    pbVar3 = pbVar3 + lVar2;
  }
  return pbVar3 + -2;
}

Assistant:

static uint8_t* findNextMarker(uint8_t* buffer, uint8_t* end)
    {
        // uint8_t* bufStart = buffer;
        for (buffer += 2; buffer < end;)
        {
            if (*buffer > 1)
                buffer += 3;
            else if (*buffer == 0)
                buffer++;
            else  // *buffer == 1
            {
                if (buffer[-2] == 0 && buffer[-1] == 0)
                    return buffer - 2;
                buffer += 3;
            }
        }
        return end;
    }